

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extensions.cc
# Opt level: O2

bool bssl::tls1_record_handshake_hashes_for_channel_id(SSL_HANDSHAKE *hs)

{
  ssl_session_st *psVar1;
  bool bVar2;
  ulong in_RAX;
  size_t size;
  size_t digest_len;
  ulong local_28;
  
  if ((hs->ssl->session)._M_t.super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>._M_t.
      super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
      super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl == (ssl_session_st *)0x0) {
    psVar1 = (hs->new_session)._M_t.super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>.
             _M_t.super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
             super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl;
    local_28 = in_RAX;
    size = SSLTranscript::DigestLen(&hs->transcript);
    InplaceVector<unsigned_char,_64UL>::ResizeForOverwrite(&psVar1->original_handshake_hash,size);
    bVar2 = SSLTranscript::GetHash
                      (&hs->transcript,
                       (uint8_t *)
                       &((hs->new_session)._M_t.
                         super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>._M_t.
                         super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
                         super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl)->
                        original_handshake_hash,&local_28);
    if ((bVar2) &&
       (local_28 !=
        (((hs->new_session)._M_t.super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>._M_t
          .super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
          super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl)->original_handshake_hash).
        size_)) {
      __assert_fail("digest_len == hs->new_session->original_handshake_hash.size()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/extensions.cc"
                    ,0x1276,
                    "bool bssl::tls1_record_handshake_hashes_for_channel_id(SSL_HANDSHAKE *)");
    }
  }
  else {
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool tls1_record_handshake_hashes_for_channel_id(SSL_HANDSHAKE *hs) {
  SSL *const ssl = hs->ssl;
  // This function should never be called for a resumed session because the
  // handshake hashes that we wish to record are for the original, full
  // handshake.
  if (ssl->session != NULL) {
    return false;
  }

  size_t digest_len;
  hs->new_session->original_handshake_hash.ResizeForOverwrite(
      hs->transcript.DigestLen());
  if (!hs->transcript.GetHash(hs->new_session->original_handshake_hash.data(),
                              &digest_len)) {
    return false;
  }
  assert(digest_len == hs->new_session->original_handshake_hash.size());
  return true;
}